

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

Node * __thiscall
sjtu::map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::
search(map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
       *this,long *key)

{
  bool bVar1;
  long *in_RSI;
  long *in_RDI;
  Node *x;
  Node *local_30;
  bool local_22;
  bool local_21;
  Node *local_18;
  
  local_18 = *(Node **)(*in_RDI + 0x10);
  while( true ) {
    local_21 = false;
    if (local_18 != (Node *)*in_RDI) {
      bVar1 = std::less<long>::operator()((less<long> *)(in_RDI + 2),in_RSI,&local_18->value->first)
      ;
      local_22 = true;
      if (!bVar1) {
        local_22 = std::less<long>::operator()
                             ((less<long> *)(in_RDI + 2),&local_18->value->first,in_RSI);
      }
      local_21 = local_22;
    }
    if (local_21 == false) break;
    bVar1 = std::less<long>::operator()((less<long> *)(in_RDI + 2),in_RSI,&local_18->value->first);
    if (bVar1) {
      local_30 = local_18->left;
    }
    else {
      local_30 = local_18->right;
    }
    local_18 = local_30;
  }
  return local_18;
}

Assistant:

Node *search(const Key &key) const
	{
		Node *x = nil -> left;
		for (;x != nil && (compare(key , x -> value -> first) || compare(x -> value -> first , key));x = compare(key , x -> value -> first) ? x -> left : x -> right);
		return x;
	}